

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

bool __thiscall cmMakefile::PlatformIsx32(cmMakefile *this)

{
  int iVar1;
  string *psVar2;
  pointer __s1;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"CMAKE_INTERNAL_PLATFORM_ABI","");
  psVar2 = GetDef(this,&local_38);
  if (psVar2 == (string *)0x0) {
    __s1 = (char *)0x0;
  }
  else {
    __s1 = (psVar2->_M_dataplus)._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if ((__s1 != (char *)0x0) && (iVar1 = strcmp(__s1,"ELF X32"), iVar1 == 0)) {
    return true;
  }
  return false;
}

Assistant:

bool cmMakefile::PlatformIsx32() const
{
  if (const char* plat_abi =
        this->GetDefinition("CMAKE_INTERNAL_PLATFORM_ABI")) {
    if (strcmp(plat_abi, "ELF X32") == 0) {
      return true;
    }
  }
  return false;
}